

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

void __thiscall cplus::socket::SocketServer::SocketServer(SocketServer *this,uint16_t port)

{
  int iVar1;
  ServerException *pSVar2;
  socklen_t __len;
  int __n;
  sockaddr *__addr;
  uint __fd;
  allocator local_c9;
  string local_c8 [32];
  Long local_a8;
  String local_98;
  allocator local_69;
  string local_68 [32];
  String local_48;
  String local_30;
  uint16_t local_12;
  SocketServer *pSStack_10;
  uint16_t port_local;
  SocketServer *this_local;
  
  local_12 = port;
  pSStack_10 = this;
  lang::Object::Object(&this->super_Object);
  __len = 0x149220;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00149220;
  (this->server_addr).sin_family = 0;
  (this->server_addr).sin_port = 0;
  (this->server_addr).sin_addr.s_addr = 0;
  memset((this->server_addr).sin_zero,0,8);
  this->server_socket = 0;
  this->lengthOfListenQueue = 0x14;
  __fd = (uint)local_12;
  iVar1 = bind(this,(uint)local_12,__addr,__len);
  if (iVar1 != 0) {
    pSVar2 = (ServerException *)__cxa_allocate_exception(0x838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Server Bind Port : ",&local_69);
    lang::Long::Long(&local_a8,(ulong)local_12);
    lang::Long::toString(&local_98,&local_a8);
    lang::operator+(&local_48,(string *)local_68,&local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8," Failed!",&local_c9);
    lang::String::operator+(&local_30,&local_48,(string *)local_c8);
    ServerException::ServerException(pSVar2,&local_30);
    __cxa_throw(pSVar2,&ServerException::typeinfo,ServerException::~ServerException);
  }
  iVar1 = listen(this,__fd,__n);
  if (iVar1 != 0) {
    pSVar2 = (ServerException *)__cxa_allocate_exception(0x838);
    ServerException::ServerException(pSVar2,"Server Listen Failed!");
    __cxa_throw(pSVar2,&ServerException::typeinfo,ServerException::~ServerException);
  }
  return;
}

Assistant:

SocketServer::SocketServer(uint16_t port) {
			//把socket和socket地址结构联系起来
			if (bind(port)) {
				throw ServerException("Server Bind Port : " + lang::Long(port).toString() + " Failed!");
			}
			//server_socket用于监听
			if (listen()) {
				throw ServerException("Server Listen Failed!");
			}
		}